

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_ce6936::TestPresetOptionalFilterIncludeIndexHelper
          (optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out,Value *value
          )

{
  bool bVar1;
  ReadFileResult RVar2;
  String SStack_38;
  
  if (value == (Value *)0x0) {
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
    _M_reset((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
              *)out);
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      bVar1 = Json::Value::isObject(value);
      if (!bVar1) {
        return INVALID_PRESET;
      }
      RVar2 = std::
              function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*)>
              ::operator()((function<cmCMakePresetsGraph::ReadFileResult_(std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>_&,_const_Json::Value_*)>
                            *)(anonymous_namespace)::
                              TestPresetOptionalFilterIncludeIndexObjectHelper,out,value);
      return RVar2;
    }
    std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::emplace<>(out);
    Json::Value::asString_abi_cxx11_(&SStack_38,value);
    std::__cxx11::string::operator=
              ((string *)
               &(out->
                super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
                )._M_payload.
                super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
                .
                super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                ._M_payload._M_value.IndexFile,(string *)&SStack_38);
    std::__cxx11::string::~string((string *)&SStack_38);
  }
  return READ_OK;
}

Assistant:

ReadFileResult TestPresetOptionalFilterIncludeIndexHelper(
  cm::optional<TestPreset::IncludeOptions::IndexOptions>& out,
  const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (value->isString()) {
    out.emplace();
    out->IndexFile = value->asString();
    return ReadFileResult::READ_OK;
  }

  if (value->isObject()) {
    return TestPresetOptionalFilterIncludeIndexObjectHelper(out, value);
  }

  return ReadFileResult::INVALID_PRESET;
}